

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_test.cpp
# Opt level: O2

void __thiscall compute_boundary_test_2::test_method(compute_boundary_test_2 *this)

{
  long lVar1;
  size_t cell;
  long lVar2;
  undefined8 *puVar3;
  Bitmap_cubical_complex *pBVar4;
  initializer_list<double> __l;
  initializer_list<unsigned_int> __l_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> coboundaryElements;
  undefined **local_178;
  undefined1 local_170;
  undefined8 *local_168;
  char **local_160;
  size_t local_158;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bd;
  undefined1 local_138 [8];
  undefined8 local_130;
  shared_count sStack_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> dimensions;
  vector<double,_std::allocator<double>_> increasingFiltrationOfTopDimensionalCells;
  Bitmap_cubical_complex increasing;
  
  puVar3 = &DAT_00119e38;
  pBVar4 = &increasing;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pBVar4->super_Bitmap_cubical_complex_base<double>)._vptr_Bitmap_cubical_complex_base =
         (_func_int **)*puVar3;
    puVar3 = puVar3 + 1;
    pBVar4 = (Bitmap_cubical_complex *)&(pBVar4->super_Bitmap_cubical_complex_base<double>).sizes;
  }
  __l._M_len = 9;
  __l._M_array = (iterator)&increasing;
  std::vector<double,_std::allocator<double>_>::vector
            (&increasingFiltrationOfTopDimensionalCells,__l,(allocator_type *)&local_178);
  increasing.super_Bitmap_cubical_complex_base<double>._vptr_Bitmap_cubical_complex_base =
       (_func_int **)0x300000003;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&increasing;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&dimensions,__l_00,(allocator_type *)&local_178);
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
  Bitmap_cubical_complex(&increasing,&dimensions,&increasingFiltrationOfTopDimensionalCells,true);
  coboundaryElements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  coboundaryElements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  coboundaryElements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178 = (undefined **)0x7;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x9;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0xa;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0xb;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0xc;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0xd;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0xa;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0xa;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0xc;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0xc;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x7;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x15;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0xf;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x16;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x9;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x17;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0xf;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x11;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0xa;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x18;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0xb;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x19;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x11;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x13;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0xc;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x1a;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0xd;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x1b;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x13;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x16;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x16;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x18;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x18;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x1a;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x1a;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x15;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x23;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x1d;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x16;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x24;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x17;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x25;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x1d;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x1f;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x18;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x26;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x19;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x27;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x1f;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x21;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x1a;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x28;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x1b;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x29;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x21;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x24;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x24;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x26;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x26;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x28;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x28;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x23;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x2b;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x24;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x25;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x2b;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x2d;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x26;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x27;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x2d;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x2f;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x28;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x29;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  local_178 = (undefined **)0x2f;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&coboundaryElements,(unsigned_long *)&local_178);
  lVar1 = 0;
  cell = 0;
  while (cell != (long)increasing.super_Bitmap_cubical_complex_base<double>.data.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)increasing.super_Bitmap_cubical_complex_base<double>.data.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) {
    local_158 = cell;
    Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::get_coboundary_of_a_cell
              (&bd,&increasing.super_Bitmap_cubical_complex_base<double>,cell);
    for (lVar2 = 0;
        lVar2 != (long)bd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)bd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3; lVar2 = lVar2 + 1) {
      local_f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
      ;
      local_e8 = "";
      local_100 = &boost::unit_test::basic_cstring<char_const>::null;
      local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0xf7,&local_100);
      local_138[0] = coboundaryElements.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar1] ==
                     bd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar2];
      local_130 = 0;
      sStack_128.pi_ = (sp_counted_base *)0x0;
      local_110 = "coboundaryElements[number] == bd[j]";
      local_108 = "";
      local_170 = 0;
      local_178 = &PTR__lazy_ostream_00122ba8;
      local_168 = &boost::unit_test::lazy_ostream::inst;
      local_160 = &local_110;
      local_120 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
      ;
      local_118 = "";
      boost::test_tools::tt_detail::report_assertion(local_138,&local_178,&local_120,0xf7,1,0,0);
      boost::detail::shared_count::~shared_count(&sStack_128);
      lVar1 = lVar1 + 1;
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&bd.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    cell = local_158 + 1;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&coboundaryElements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
  ~Bitmap_cubical_complex(&increasing);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&dimensions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&increasingFiltrationOfTopDimensionalCells.
              super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(compute_boundary_test_2) {
  std::vector<double> increasingFiltrationOfTopDimensionalCells({1, 2, 3, 4, 5, 6, 7, 8, 9});

  std::vector<unsigned> dimensions({3, 3});

  Bitmap_cubical_complex increasing(dimensions, increasingFiltrationOfTopDimensionalCells);

  std::vector<size_t> coboundaryElements;
  coboundaryElements.push_back(7);
  coboundaryElements.push_back(1);
  coboundaryElements.push_back(8);
  coboundaryElements.push_back(9);
  coboundaryElements.push_back(1);
  coboundaryElements.push_back(3);
  coboundaryElements.push_back(10);
  coboundaryElements.push_back(11);
  coboundaryElements.push_back(3);
  coboundaryElements.push_back(5);
  coboundaryElements.push_back(12);
  coboundaryElements.push_back(13);
  coboundaryElements.push_back(5);
  coboundaryElements.push_back(8);
  coboundaryElements.push_back(8);
  coboundaryElements.push_back(10);
  coboundaryElements.push_back(10);
  coboundaryElements.push_back(12);
  coboundaryElements.push_back(12);
  coboundaryElements.push_back(7);
  coboundaryElements.push_back(21);
  coboundaryElements.push_back(15);
  coboundaryElements.push_back(8);
  coboundaryElements.push_back(22);
  coboundaryElements.push_back(9);
  coboundaryElements.push_back(23);
  coboundaryElements.push_back(15);
  coboundaryElements.push_back(17);
  coboundaryElements.push_back(10);
  coboundaryElements.push_back(24);
  coboundaryElements.push_back(11);
  coboundaryElements.push_back(25);
  coboundaryElements.push_back(17);
  coboundaryElements.push_back(19);
  coboundaryElements.push_back(12);
  coboundaryElements.push_back(26);
  coboundaryElements.push_back(13);
  coboundaryElements.push_back(27);
  coboundaryElements.push_back(19);
  coboundaryElements.push_back(22);
  coboundaryElements.push_back(22);
  coboundaryElements.push_back(24);
  coboundaryElements.push_back(24);
  coboundaryElements.push_back(26);
  coboundaryElements.push_back(26);
  coboundaryElements.push_back(21);
  coboundaryElements.push_back(35);
  coboundaryElements.push_back(29);
  coboundaryElements.push_back(22);
  coboundaryElements.push_back(36);
  coboundaryElements.push_back(23);
  coboundaryElements.push_back(37);
  coboundaryElements.push_back(29);
  coboundaryElements.push_back(31);
  coboundaryElements.push_back(24);
  coboundaryElements.push_back(38);
  coboundaryElements.push_back(25);
  coboundaryElements.push_back(39);
  coboundaryElements.push_back(31);
  coboundaryElements.push_back(33);
  coboundaryElements.push_back(26);
  coboundaryElements.push_back(40);
  coboundaryElements.push_back(27);
  coboundaryElements.push_back(41);
  coboundaryElements.push_back(33);
  coboundaryElements.push_back(36);
  coboundaryElements.push_back(36);
  coboundaryElements.push_back(38);
  coboundaryElements.push_back(38);
  coboundaryElements.push_back(40);
  coboundaryElements.push_back(40);
  coboundaryElements.push_back(35);
  coboundaryElements.push_back(43);
  coboundaryElements.push_back(36);
  coboundaryElements.push_back(37);
  coboundaryElements.push_back(43);
  coboundaryElements.push_back(45);
  coboundaryElements.push_back(38);
  coboundaryElements.push_back(39);
  coboundaryElements.push_back(45);
  coboundaryElements.push_back(47);
  coboundaryElements.push_back(40);
  coboundaryElements.push_back(41);
  coboundaryElements.push_back(47);

  size_t number = 0;
  for (size_t i = 0; i != increasing.size(); ++i) {
    std::vector<size_t> bd = increasing.get_coboundary_of_a_cell(i);
    for (size_t j = 0; j != bd.size(); ++j) {
      BOOST_CHECK(coboundaryElements[number] == bd[j]);
      ++number;
    }
  }
}